

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximpl.h
# Opt level: O3

bool __thiscall YAML::RegEx::Matches<YAML::StringCharSource>(RegEx *this,StringCharSource *source)

{
  pointer pRVar1;
  RegEx *this_00;
  uint uVar2;
  uint uVar3;
  pointer pRVar4;
  RegEx *param;
  long lVar5;
  ulong uVar6;
  
  uVar6 = source->m_offset;
  uVar2 = 0xffffffff;
  uVar3 = uVar2;
  if (source->m_size <= uVar6 && 0xfffffffd < this->m_op - REGEX_OR) goto switchD_0070bcc7_default;
  switch(this->m_op) {
  case REGEX_EMPTY:
    uVar3 = -(uint)(uVar6 < source->m_size);
    break;
  case REGEX_MATCH:
    uVar3 = (uint)(source->m_str[uVar6] == this->m_a) * 2 - 1;
    break;
  case REGEX_RANGE:
    uVar3 = -(uint)(this->m_z < source->m_str[uVar6] || source->m_str[uVar6] < this->m_a);
    goto LAB_0070bd93;
  case REGEX_OR:
    pRVar4 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
             super__Vector_impl_data._M_start;
    pRVar1 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while ((uVar3 = uVar2, pRVar4 != pRVar1 &&
           (uVar3 = MatchUnchecked<YAML::StringCharSource>(pRVar4,source), (int)uVar3 < 0))) {
      pRVar4 = pRVar4 + 1;
    }
    break;
  case REGEX_AND:
    pRVar4 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
        super__Vector_impl_data._M_finish != pRVar4) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        uVar2 = MatchUnchecked<YAML::StringCharSource>
                          ((RegEx *)((long)&pRVar4->m_op + lVar5),source);
        if (uVar2 == 0xffffffff) {
          uVar3 = 0xffffffff;
          break;
        }
        if (uVar6 == 0) {
          uVar3 = uVar2;
        }
        uVar6 = uVar6 + 1;
        pRVar4 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x20;
      } while (uVar6 < (ulong)((long)(this->m_params).
                                     super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pRVar4 >> 5))
      ;
    }
    break;
  case REGEX_NOT:
    this_00 = (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl
              .super__Vector_impl_data._M_start;
    if (this_00 ==
        (this->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    uVar3 = MatchUnchecked<YAML::StringCharSource>(this_00,source);
    uVar3 = (int)~uVar3 >> 0x1f;
LAB_0070bd93:
    uVar3 = uVar3 | 1;
    break;
  case REGEX_SEQ:
    uVar3 = MatchOpSeq<YAML::StringCharSource>(this,source);
  }
switchD_0070bcc7_default:
  return -1 < (int)uVar3;
}

Assistant:

inline bool RegEx::Matches(const Source& source) const {
  return Match(source) >= 0;
}